

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::initializeFaceTree(btSoftBody *this)

{
  Face *f;
  Face *pFVar1;
  btDbvtNode *pbVar2;
  int i;
  long lVar3;
  long lVar4;
  btDbvtVolume local_50;
  
  btDbvt::clear(&this->m_fdbvt);
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (this->m_faces).m_size; lVar3 = lVar3 + 1) {
    pFVar1 = (this->m_faces).m_data;
    f = (Face *)((long)pFVar1->m_n + lVar4 + -0x10);
    VolumeOf(&local_50,f,0.0);
    pbVar2 = btDbvt::insert(&this->m_fdbvt,&local_50,f);
    *(btDbvtNode **)((long)(&pFVar1->m_normal + 1) + lVar4 + 8) = pbVar2;
    lVar4 = lVar4 + 0x48;
  }
  return;
}

Assistant:

void			btSoftBody::initializeFaceTree()
{
	m_fdbvt.clear();
	for(int i=0;i<m_faces.size();++i)
	{
		Face&	f=m_faces[i];
		f.m_leaf=m_fdbvt.insert(VolumeOf(f,0),&f);
	}
}